

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

void xmlThrDefSetGenericErrorFunc(void *ctx,xmlGenericErrorFunc handler)

{
  xmlGenericErrorFunc handler_local;
  void *ctx_local;
  
  xmlMutexLock(xmlThrDefMutex);
  xmlGenericErrorThrDef = handler;
  if (handler == (xmlGenericErrorFunc)0x0) {
    xmlGenericErrorThrDef = xmlGenericErrorDefaultFunc;
  }
  xmlGenericErrorContextThrDef = ctx;
  xmlMutexUnlock(xmlThrDefMutex);
  return;
}

Assistant:

void
xmlThrDefSetGenericErrorFunc(void *ctx, xmlGenericErrorFunc handler) {
    xmlMutexLock(xmlThrDefMutex);
    xmlGenericErrorContextThrDef = ctx;
    if (handler != NULL)
	xmlGenericErrorThrDef = handler;
    else
	xmlGenericErrorThrDef = xmlGenericErrorDefaultFunc;
    xmlMutexUnlock(xmlThrDefMutex);
}